

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O3

void __thiscall
SchnorrPubkey_FromPubkey_Test::~SchnorrPubkey_FromPubkey_Test(SchnorrPubkey_FromPubkey_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SchnorrPubkey, FromPubkey) {
  bool is_parity = false;
  auto actual_pubkey = SchnorrPubkey::FromPubkey(sk.GetPubkey(), &is_parity);
  EXPECT_EQ(pubkey.GetHex(), actual_pubkey.GetHex());
  EXPECT_EQ(pubkey_parity, is_parity);

  Pubkey pk_a1("024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_a2("034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_b1("02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  Pubkey pk_b2("03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  std::string exp_pk_a = "4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d";
  std::string exp_pk_b = "dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54";
  std::string exp_pk_c2 = "03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";
  std::string exp_pk_c2p = "02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";

  bool parity[4];
  auto spk_a1 = SchnorrPubkey::FromPubkey(pk_a1, &parity[0]);
  auto spk_a2 = SchnorrPubkey::FromPubkey(pk_a2, &parity[1]);
  auto spk_b1 = SchnorrPubkey::FromPubkey(pk_b1, &parity[2]);
  auto spk_b2 = SchnorrPubkey::FromPubkey(pk_b2, &parity[3]);

  EXPECT_EQ(exp_pk_a, spk_a1.GetHex());
  EXPECT_FALSE(parity[0]);
  EXPECT_EQ(exp_pk_a, spk_a2.GetHex());
  EXPECT_TRUE(parity[1]);
  EXPECT_EQ(exp_pk_b, spk_b1.GetHex());
  EXPECT_FALSE(parity[2]);
  EXPECT_EQ(exp_pk_b, spk_b2.GetHex());
  EXPECT_TRUE(parity[3]);

  Pubkey pk_aa1 = spk_a1.CreatePubkey(parity[0]);
  EXPECT_EQ(pk_a1.GetHex(), pk_aa1.GetHex());

}